

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_Matcher_x_iutest_x_EachAllOf_Test::Body(iu_Matcher_x_iutest_x_EachAllOf_Test *this)

{
  vector<int,_std::allocator<int>_> *v;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  string local_228;
  string local_208;
  iuCodeMessage local_1e8;
  AssertionResult local_1b8;
  undefined1 local_190 [16];
  undefined **local_180;
  undefined1 *local_178;
  undefined **local_170;
  iuCodeMessage *local_168;
  
  local_178 = (undefined1 *)&local_228;
  local_168 = &local_1e8;
  local_1e8.m_message._M_dataplus._M_p._0_4_ = 0;
  local_228._M_dataplus._M_p._0_4_ = 10;
  local_190._0_8_ = &PTR__EachMatcher_00227c00;
  local_190._8_8_ = &PTR__AllOfMatcher_00227bc0;
  local_180 = &PTR__IMatcher_00224780;
  local_170 = &PTR__IMatcher_00224880;
  iutest::detail::
  EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
  ::operator()(&local_1b8,
               (EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
                *)local_190,(vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::va);
  if (local_1b8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_208,(iutest *)&(anonymous_namespace)::va,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_228,(detail *)local_208._M_dataplus._M_p,"Each(AllOf( Ge(0), Le(10) ))",
               (char *)&local_1b8,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x399,(char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                       local_228._M_dataplus._M_p._0_4_));
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_190);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

IUTEST(Matcher, EachAllOf)
{
    IUTEST_EXPECT_THAT(va, Each(AllOf( Ge(0), Le(10) )));
}